

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_columnref_expression.cpp
# Opt level: O1

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,ColumnRefExpression *col_ref_p,
          idx_t depth,bool root_expression)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  DummyBinding *pDVar2;
  size_t __n;
  pointer pcVar3;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> _Var4;
  idx_t depth_00;
  BindingMode BVar5;
  int iVar6;
  BoundConstantExpression *this_00;
  pointer pPVar7;
  BaseExpression *this_01;
  string *psVar8;
  pointer pEVar9;
  ColumnRefExpression *pCVar10;
  undefined1 auVar11 [8];
  optional_ptr<duckdb::DummyBinding,_true> *poVar12;
  bool bVar13;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> expr;
  BoundColumnReferenceInfo ref;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  value_function;
  ErrorData error;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_210;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_208;
  ColumnRefExpression *local_200;
  undefined1 local_1f8 [8];
  undefined1 local_1f0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  Val local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1a8 [56];
  string local_170;
  idx_t local_150;
  LogicalType local_148;
  undefined1 local_130 [32];
  Val VStack_110;
  element_type *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_e8 [56];
  undefined1 local_b0 [40];
  _Alloc_hider local_88;
  element_type *local_80;
  char local_78 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68 [56];
  
  BVar5 = Binder::GetBindingMode(this->binder);
  if (BVar5 == EXTRACT_NAMES) {
    LogicalType::LogicalType(&local_148,SQLNULL);
    Value::Value((Value *)local_130,&local_148);
    this_00 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value((Value *)local_1f8,(Value *)local_130);
    BoundConstantExpression::BoundConstantExpression(this_00,(Value *)local_1f8);
    Value::~Value((Value *)local_1f8);
    local_208._M_head_impl = (Expression *)this_00;
    BindResult::BindResult
              (__return_storage_ptr__,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_208);
    if ((BoundConstantExpression *)local_208._M_head_impl != (BoundConstantExpression *)0x0) {
      (*(((Expression *)&(local_208._M_head_impl)->super_BaseExpression)->super_BaseExpression).
        _vptr_BaseExpression[1])();
    }
    local_208._M_head_impl = (Expression *)0x0;
    Value::~Value((Value *)local_130);
    LogicalType::~LogicalType(&local_148);
    return __return_storage_ptr__;
  }
  ErrorData::ErrorData((ErrorData *)local_130);
  (*this->_vptr_ExpressionBinder[2])(&local_210,this,col_ref_p,(ErrorData *)local_130);
  if (local_210._M_head_impl == (ParsedExpression *)0x0) {
    bVar13 = ColumnRefExpression::IsQualified(col_ref_p);
    if (!bVar13) {
      BindResult::BindResult((BindResult *)local_1f8);
      iVar6 = (*this->_vptr_ExpressionBinder[3])(this,col_ref_p,root_expression,local_1f8);
      auVar11 = local_1f0;
      if ((char)iVar6 != '\0') {
        (__return_storage_ptr__->expression).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false> =
             (_Head_base<0UL,_duckdb::Expression_*,_false>)local_1f8;
        local_1f8 = (undefined1  [8])0x0;
        (__return_storage_ptr__->error).initialized = (bool)local_1f0[0];
        (__return_storage_ptr__->error).type = local_1f0[1];
        paVar1 = &(__return_storage_ptr__->error).raw_message.field_2;
        (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)paVar1;
        if ((Val *)local_1e8._M_allocated_capacity == &local_1d8) {
          *(int32_t *)paVar1 = local_1d8.integer;
          *(int32_t *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 4) =
               local_1d8.interval.days;
          *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 8) =
               local_1d8.hugeint.upper._0_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 0xc) =
               local_1d8.hugeint.upper._4_4_;
        }
        else {
          (__return_storage_ptr__->error).raw_message._M_dataplus._M_p =
               (pointer)local_1e8._M_allocated_capacity;
          (__return_storage_ptr__->error).raw_message.field_2._M_allocated_capacity =
               local_1d8.bigint;
        }
        (__return_storage_ptr__->error).raw_message._M_string_length = local_1e8._8_8_;
        local_1e8._8_8_ = 0;
        local_1d8.ubigint = local_1d8.ubigint & 0xffffffffffffff00;
        paVar1 = &(__return_storage_ptr__->error).final_message.field_2;
        (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_allocated_capacity == &local_1b8) {
          *(undefined4 *)paVar1 = local_1b8._M_allocated_capacity._0_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 4) =
               local_1b8._M_allocated_capacity._4_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 8) =
               local_1b8._8_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 0xc) =
               local_1b8._12_4_;
        }
        else {
          (__return_storage_ptr__->error).final_message._M_dataplus._M_p =
               (pointer)local_1c8._M_allocated_capacity;
          (__return_storage_ptr__->error).final_message.field_2._M_allocated_capacity =
               CONCAT44(local_1b8._M_allocated_capacity._4_4_,local_1b8._M_allocated_capacity._0_4_)
          ;
        }
        (__return_storage_ptr__->error).final_message._M_string_length = local_1c8._8_8_;
        local_1c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1b8._M_allocated_capacity._0_4_ = local_1b8._M_allocated_capacity._0_4_ & 0xffffff00;
        local_1f0 = auVar11;
        local_1e8._M_allocated_capacity = (size_type)&local_1d8;
        local_1c8._M_allocated_capacity = (size_type)&local_1b8;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&(__return_storage_ptr__->error).extra_info,local_1a8);
LAB_006d0df5:
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_allocated_capacity != &local_1b8) {
          operator_delete((void *)local_1c8._M_allocated_capacity);
        }
        if ((Val *)local_1e8._M_allocated_capacity != &local_1d8) {
          operator_delete((void *)local_1e8._M_allocated_capacity);
        }
        if (local_1f8 != (undefined1  [8])0x0) {
          (*((BaseExpression *)local_1f8)->_vptr_BaseExpression[1])();
        }
        goto LAB_006d0c61;
      }
      iVar6 = (*this->_vptr_ExpressionBinder[4])(this,col_ref_p);
      if ((char)iVar6 == '\0') {
        psVar8 = ColumnRefExpression::GetColumnName_abi_cxx11_(col_ref_p);
        (*this->_vptr_ExpressionBinder[6])(&local_170,this,psVar8);
        if ((long *)local_170._M_dataplus._M_p != (long *)0x0) {
          (*this->_vptr_ExpressionBinder[5])(__return_storage_ptr__,this,&local_170,depth,0);
          if ((long *)local_170._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_170._M_dataplus._M_p + 8))();
          }
          goto LAB_006d0df5;
        }
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_allocated_capacity != &local_1b8) {
        operator_delete((void *)local_1c8._M_allocated_capacity);
      }
      if ((Val *)local_1e8._M_allocated_capacity != &local_1d8) {
        operator_delete((void *)local_1e8._M_allocated_capacity);
      }
      if (local_1f8 != (undefined1  [8])0x0) {
        (*((BaseExpression *)local_1f8)->_vptr_BaseExpression[1])();
      }
    }
    ErrorData::AddQueryLocation((ErrorData *)local_130,&col_ref_p->super_ParsedExpression);
    local_b0._0_2_ = local_130._0_2_;
    if ((Expression *)local_130._8_8_ == (Expression *)(local_130 + 0x18)) {
      local_b0._32_4_ = VStack_110.integer;
      local_b0._36_4_ = VStack_110.interval.days;
      local_b0._8_8_ = (Expression *)(local_b0 + 0x18);
    }
    else {
      local_b0._8_8_ = local_130._8_8_;
    }
    local_b0._16_8_ = local_130._16_8_;
    local_130._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_130._24_4_ = local_130._24_4_ & 0xffffff00;
    if (VStack_110._8_8_ == local_130 + 0x38) {
      local_78[8] = local_f8._M_local_buf[8];
      local_78[9] = local_f8._M_local_buf[9];
      local_78[10] = local_f8._M_local_buf[10];
      local_78[0xb] = local_f8._M_local_buf[0xb];
      local_78[0xc] = local_f8._M_local_buf[0xc];
      local_78[0xd] = local_f8._M_local_buf[0xd];
      local_78[0xe] = local_f8._M_local_buf[0xe];
      local_78[0xf] = local_f8._M_local_buf[0xf];
      local_88._M_p = local_b0 + 0x38;
    }
    else {
      local_88._M_p = (pointer)VStack_110.hugeint.upper;
    }
    local_80 = local_100;
    local_100 = (element_type *)0x0;
    local_f8._M_allocated_capacity._0_4_ = local_f8._M_allocated_capacity._0_4_ & 0xffffff00;
    local_130._8_8_ = (Expression *)(local_130 + 0x18);
    VStack_110.hugeint.upper = (int64_t)(local_130 + 0x38);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(local_b0 + 0x48),local_130 + 0x48);
    BindResult::BindResult(__return_storage_ptr__,(ErrorData *)local_b0);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_b0 + 0x48));
    if (local_88._M_p != local_b0 + 0x38) {
      operator_delete(local_88._M_p);
    }
    auVar11 = (undefined1  [8])local_b0._8_8_;
    if ((Expression *)local_b0._8_8_ == (Expression *)(local_b0 + 0x18)) goto LAB_006d0c61;
  }
  else {
    pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)&local_210);
    (pPVar7->super_BaseExpression).query_location.index =
         (col_ref_p->super_ParsedExpression).super_BaseExpression.query_location.index;
    pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)&local_210);
    if ((pPVar7->super_BaseExpression).type == COLUMN_REF) {
      BindResult::BindResult(__return_storage_ptr__);
      this_01 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)&local_210)->super_BaseExpression;
      local_200 = BaseExpression::Cast<duckdb::ColumnRefExpression>(this_01);
      local_150 = depth;
      psVar8 = ColumnRefExpression::GetTableName_abi_cxx11_(local_200);
      pDVar2 = (this->binder->macro_binding).ptr;
      if (pDVar2 == (DummyBinding *)0x0) {
LAB_006d094e:
        bVar13 = false;
      }
      else {
        poVar12 = &this->binder->macro_binding;
        optional_ptr<duckdb::DummyBinding,_true>::CheckValid(poVar12);
        Binding::GetAlias_abi_cxx11_(&local_170,&poVar12->ptr->super_Binding);
        __n = psVar8->_M_string_length;
        if (__n != local_170._M_string_length) goto LAB_006d094e;
        if (__n == 0) {
          bVar13 = true;
        }
        else {
          iVar6 = bcmp((psVar8->_M_dataplus)._M_p,local_170._M_dataplus._M_p,__n);
          bVar13 = iVar6 == 0;
        }
      }
      depth_00 = local_150;
      if ((pDVar2 != (DummyBinding *)0x0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2)) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      pCVar10 = local_200;
      if (bVar13) {
        poVar12 = &this->binder->macro_binding;
        optional_ptr<duckdb::DummyBinding,_true>::CheckValid(poVar12);
        pCVar10 = local_200;
        pDVar2 = poVar12->ptr;
        (*(pDVar2->super_Binding)._vptr_Binding[3])(local_1f8,pDVar2,local_200,depth_00);
        auVar11 = local_1f8;
        local_1f8 = (undefined1  [8])0x0;
        _Var4.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (__return_storage_ptr__->expression).
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>;
        (__return_storage_ptr__->expression).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false> =
             (_Head_base<0UL,_duckdb::Expression_*,_false>)auVar11;
        if (_Var4.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
            (Expression *)0x0) {
          (**(code **)(*(long *)_Var4.super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                _M_head_impl + 8))();
        }
        auVar11 = local_1f0;
        (__return_storage_ptr__->error).initialized = (bool)local_1f0[0];
        (__return_storage_ptr__->error).type = local_1f0[1];
        local_1f0 = auVar11;
        ::std::__cxx11::string::operator=
                  ((string *)&(__return_storage_ptr__->error).raw_message,(string *)(local_1f0 + 8))
        ;
        ::std::__cxx11::string::operator=
                  ((string *)&(__return_storage_ptr__->error).final_message,
                   (string *)local_1c8._M_local_buf);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)&(__return_storage_ptr__->error).extra_info,local_1a8);
      }
      else {
        BindContext::BindColumn
                  ((BindResult *)local_1f8,&this->binder->bind_context,local_200,depth_00);
        auVar11 = local_1f8;
        local_1f8 = (undefined1  [8])0x0;
        _Var4.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (__return_storage_ptr__->expression).
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>;
        (__return_storage_ptr__->expression).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false> =
             (_Head_base<0UL,_duckdb::Expression_*,_false>)auVar11;
        if (_Var4.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
            (Expression *)0x0) {
          (**(code **)(*(long *)_Var4.super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                _M_head_impl + 8))();
        }
        auVar11 = local_1f0;
        (__return_storage_ptr__->error).initialized = (bool)local_1f0[0];
        (__return_storage_ptr__->error).type = local_1f0[1];
        local_1f0 = auVar11;
        ::std::__cxx11::string::operator=
                  ((string *)&(__return_storage_ptr__->error).raw_message,(string *)(local_1f0 + 8))
        ;
        ::std::__cxx11::string::operator=
                  ((string *)&(__return_storage_ptr__->error).final_message,
                   (string *)local_1c8._M_local_buf);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)&(__return_storage_ptr__->error).extra_info,local_1a8);
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_allocated_capacity != &local_1b8) {
        operator_delete((void *)local_1c8._M_allocated_capacity);
      }
      if ((Val *)local_1e8._M_allocated_capacity != &local_1d8) {
        operator_delete((void *)local_1e8._M_allocated_capacity);
      }
      if (local_1f8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1f8 + 8))();
      }
      if ((__return_storage_ptr__->error).initialized == true) {
        ErrorData::AddQueryLocation
                  (&__return_storage_ptr__->error,&col_ref_p->super_ParsedExpression);
        goto LAB_006d0c61;
      }
      local_1f8 = (undefined1  [8])((long)local_1f0 + 8);
      local_1f0 = (undefined1  [8])0x0;
      local_1e8._M_allocated_capacity = local_1e8._M_allocated_capacity & 0xffffffffffffff00;
      local_1d8.bigint = -1;
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::back(&pCVar10->column_names);
      ::std::__cxx11::string::_M_assign((string *)local_1f8);
      local_1d8.bigint = (pCVar10->super_ParsedExpression).super_BaseExpression.query_location.index
      ;
      ::std::
      vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>::
      emplace_back<duckdb::BoundColumnReferenceInfo>
                (&(this->bound_columns).
                  super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                 ,(BoundColumnReferenceInfo *)local_1f8);
    }
    else {
      pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)&local_210);
      local_1f8 = (undefined1  [8])((long)local_1f0 + 8);
      pcVar3 = (pPVar7->super_BaseExpression).alias._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f8,pcVar3,
                 pcVar3 + (pPVar7->super_BaseExpression).alias._M_string_length);
      (*this->_vptr_ExpressionBinder[5])(__return_storage_ptr__,this,&local_210,depth,0);
      if ((Expression *)
          (__return_storage_ptr__->expression).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false> != (Expression *)0x0) {
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(&__return_storage_ptr__->expression);
        ::std::__cxx11::string::operator=
                  ((string *)&(pEVar9->super_BaseExpression).alias,(string *)local_1f8);
      }
    }
    auVar11 = local_1f8;
    if (local_1f8 == (undefined1  [8])(local_1f0 + 8)) goto LAB_006d0c61;
  }
  operator_delete((void *)auVar11);
LAB_006d0c61:
  if (local_210._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_210._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_130 + 0x48));
  if (VStack_110._8_8_ != local_130 + 0x38) {
    operator_delete((void *)VStack_110.hugeint.upper);
  }
  if ((Expression *)local_130._8_8_ != (Expression *)(local_130 + 0x18)) {
    operator_delete((void *)local_130._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::BindExpression(ColumnRefExpression &col_ref_p, idx_t depth, bool root_expression) {
	if (binder.GetBindingMode() == BindingMode::EXTRACT_NAMES) {
		return BindResult(make_uniq<BoundConstantExpression>(Value(LogicalType::SQLNULL)));
	}

	ErrorData error;
	auto expr = QualifyColumnName(col_ref_p, error);
	if (!expr) {
		if (!col_ref_p.IsQualified()) {
			// column was not found
			// first try to bind it as an alias
			BindResult alias_result;
			auto found_alias = TryBindAlias(col_ref_p, root_expression, alias_result);
			if (found_alias) {
				return alias_result;
			}
			found_alias = QualifyColumnAlias(col_ref_p);
			if (!found_alias) {
				// column was not found - check if it is a SQL value function
				auto value_function = GetSQLValueFunction(col_ref_p.GetColumnName());
				if (value_function) {
					return BindExpression(value_function, depth);
				}
			}
		}
		error.AddQueryLocation(col_ref_p);
		return BindResult(std::move(error));
	}

	expr->SetQueryLocation(col_ref_p.GetQueryLocation());

	// the above QualifyColumName returns a generated expression for a generated
	// column, and struct_extract for a struct, or a lambda reference expression,
	// all of them are not column reference expressions, so we return here
	if (expr->GetExpressionType() != ExpressionType::COLUMN_REF) {
		auto alias = expr->GetAlias();
		auto result = BindExpression(expr, depth);
		if (result.expression) {
			result.expression->SetAlias(std::move(alias));
		}
		return result;
	}

	// the above QualifyColumnName returned an individual column reference
	// expression, which we resolve to either a base table or a subquery expression,
	// and if it was a macro parameter, then we let macro_binding bind it to the argument
	BindResult result;
	auto &col_ref = expr->Cast<ColumnRefExpression>();
	D_ASSERT(col_ref.IsQualified());
	auto &table_name = col_ref.GetTableName();

	if (binder.macro_binding && table_name == binder.macro_binding->GetAlias()) {
		result = binder.macro_binding->Bind(col_ref, depth);
	} else {
		result = binder.bind_context.BindColumn(col_ref, depth);
	}

	if (result.HasError()) {
		result.error.AddQueryLocation(col_ref_p);
		return result;
	}

	// we bound the column reference
	BoundColumnReferenceInfo ref;
	ref.name = col_ref.column_names.back();
	ref.query_location = col_ref.GetQueryLocation();
	bound_columns.push_back(std::move(ref));
	return result;
}